

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

float If_CutEdgeDeref(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = (float)(*(uint *)&pCut->field_0x1c >> 0x18);
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar3 = 0;
    do {
      fVar5 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar2 = (uint *)p->vObjs->pArray[(int)fVar5];
      if (puVar2 == (uint *)0x0) {
        return fVar4;
      }
      uVar1 = puVar2[3];
      if ((int)uVar1 < 1) {
        __assert_fail("pLeaf->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                      ,0x485,"float If_CutEdgeDeref(If_Man_t *, If_Cut_t *)");
      }
      puVar2[3] = uVar1 - 1;
      if ((uVar1 == 1) && ((*puVar2 & 0xf) == 4)) {
        fVar5 = If_CutEdgeDeref(p,(If_Cut_t *)(puVar2 + 0x14));
        fVar4 = fVar4 + fVar5;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (byte)pCut->field_0x1f);
  }
  return fVar4;
}

Assistant:

float If_CutEdgeDeref( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Edge;
    int i;
    Edge = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        assert( pLeaf->nRefs > 0 );
        if ( --pLeaf->nRefs > 0 || !If_ObjIsAnd(pLeaf) )
            continue;
        Edge += If_CutEdgeDeref( p, If_ObjCutBest(pLeaf) );
    }
    return Edge;
}